

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O2

int dwarf_get_macro_defundef
              (Dwarf_Macro_Context macro_context,Dwarf_Unsigned op_number,
              Dwarf_Unsigned *line_number,Dwarf_Unsigned *index,Dwarf_Unsigned *offset,
              Dwarf_Half *forms_count,char **macro_string,Dwarf_Error *error)

{
  Dwarf_Macro_Operator_s *pDVar1;
  Dwarf_Macro_Forms_s *pDVar2;
  int iVar3;
  Dwarf_Unsigned DVar4;
  char *pcVar5;
  Dwarf_Signed DVar6;
  uint attrform;
  Dwarf_Debug dbg;
  Dwarf_Small *pDVar7;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned lu_local_1;
  undefined4 local_54;
  Dwarf_Small *local_50;
  Dwarf_Small *local_48;
  Dwarf_Unsigned local_40;
  Dwarf_Unsigned lu_local_3;
  
  if (macro_context == (Dwarf_Macro_Context)0x0) {
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    dbg = macro_context->mc_dbg;
    if (macro_context->mc_sentinel == 0xada) {
      if (macro_context->mc_macro_ops_count <= op_number) {
        DVar6 = 0x143;
        goto LAB_001c87ab;
      }
      pDVar1 = macro_context->mc_ops;
      pDVar2 = pDVar1[op_number].mo_form;
      if (pDVar2->mf_formcount != '\x02') {
        return -1;
      }
      if (0xb < pDVar1[op_number].mo_opcode - 1) {
switchD_001c86ec_caseD_3:
        DVar6 = 0x144;
LAB_001c87ab:
        _dwarf_error(dbg,error,DVar6);
        return 1;
      }
      local_50 = macro_context->mc_macro_header;
      local_48 = local_50 + macro_context->mc_total_length;
      pDVar7 = pDVar1[op_number].mo_data;
      local_54 = 2;
      switch((uint)pDVar1[op_number].mo_opcode) {
      case 1:
      case 2:
        lu_leblen = 0;
        lu_local = 0;
        iVar3 = dwarf_decode_leb128((char *)pDVar7,&lu_leblen,&lu_local,(char *)local_48);
        if (iVar3 != 1) {
          local_40 = lu_local;
          pDVar7 = pDVar7 + lu_leblen;
          iVar3 = _dwarf_check_string_valid(dbg,local_50,pDVar7,local_48,0x16e,error);
          if (iVar3 == 0) {
            *line_number = local_40;
            *index = 0;
            *offset = 0;
            *forms_count = (Dwarf_Half)local_54;
            *macro_string = (char *)pDVar7;
            return 0;
          }
          return iVar3;
        }
        break;
      default:
        goto switchD_001c86ec_caseD_3;
      case 5:
      case 6:
        local_40 = CONCAT44(local_40._4_4_,(uint)pDVar2->mf_formbytes[1]);
        lu_leblen = 0;
        lu_local = 0;
        lu_local_1 = 0;
        local_50 = pDVar7;
        iVar3 = dwarf_decode_leb128((char *)pDVar7,&lu_local,&lu_local_1,(char *)local_48);
        if (iVar3 != 1) {
          pDVar7 = local_50 + lu_local;
          lu_local = 0;
          if (pDVar7 + macro_context->mc_offset_size <= local_48) {
            local_48 = (Dwarf_Small *)lu_local_1;
            (*dbg->de_copy_word)(&lu_local,pDVar7,(ulong)macro_context->mc_offset_size);
            DVar4 = lu_local;
            iVar3 = _dwarf_extract_local_debug_str_string_given_offset
                              (dbg,(uint)local_40,lu_local,(char **)&lu_leblen,error);
            *index = 0;
            *line_number = (Dwarf_Unsigned)local_48;
            *offset = DVar4;
            *forms_count = (Dwarf_Half)local_54;
            if (iVar3 == -1) {
              pcVar5 = "<Error: NO_ENTRY on .debug_string (strp)>";
            }
            else {
              pcVar5 = (char *)lu_leblen;
              if (iVar3 == 1) {
                *macro_string = "<Error: getting local .debug_str>";
                return 1;
              }
            }
LAB_001c8b0f:
            *macro_string = pcVar5;
            return 0;
          }
LAB_001c8a0e:
          pcVar5 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
          DVar6 = 0x14b;
          goto LAB_001c878f;
        }
        break;
      case 8:
      case 9:
        lu_leblen = 0;
        lu_local = 0;
        lu_local_1 = 0;
        lu_local_3 = 0;
        local_50 = pDVar7;
        iVar3 = dwarf_decode_leb128((char *)pDVar7,&lu_local_1,&lu_local_3,(char *)local_48);
        DVar4 = lu_local_3;
        if (iVar3 != 1) {
          pDVar7 = local_50 + lu_local_1;
          lu_local_1 = 0;
          if (pDVar7 + macro_context->mc_offset_size <= local_48) {
            (*dbg->de_copy_word)(&lu_local_1,pDVar7,(ulong)macro_context->mc_offset_size);
            *line_number = DVar4;
            *index = 0;
            *offset = lu_local_1;
            *forms_count = (Dwarf_Half)local_54;
            iVar3 = _dwarf_get_string_from_tied
                              (dbg,lu_local_1,(char **)&lu_leblen,(Dwarf_Error *)&lu_local);
            pcVar5 = (char *)lu_leblen;
            if (iVar3 != 0) {
              if (iVar3 == 1) {
                DVar4 = dwarf_errno((Dwarf_Error)lu_local);
                if ((DVar4 & 0xffffffff) == 0x134) {
                  pcVar5 = "<DW_FORM_str_sup-no-tied_file>";
                }
                else {
                  _dwarf_error(dbg,error,DVar4 & 0xffffffff);
                  pcVar5 = "<Error: DW_FORM_str_sup-got-error>";
                }
                *macro_string = pcVar5;
                dwarf_dealloc(dbg,(Dwarf_Ptr)lu_local,0xe);
                return 1;
              }
              *macro_string = "<DW_FORM_str_sup-no-entry>";
              return iVar3;
            }
            goto LAB_001c8b0f;
          }
          goto LAB_001c8a0e;
        }
        break;
      case 0xb:
      case 0xc:
        lu_leblen = 0;
        local_40 = CONCAT44(local_40._4_4_,(uint)pDVar2->mf_formbytes[1]);
        lu_local = 0;
        lu_local_1 = 0;
        local_50 = pDVar7;
        iVar3 = dwarf_decode_leb128((char *)pDVar7,&lu_local,&lu_local_1,(char *)local_48);
        if (iVar3 != 1) {
          pDVar7 = local_50 + lu_local;
          *line_number = lu_local_1;
          lu_local = 0;
          lu_local_1 = 0;
          iVar3 = dwarf_decode_leb128((char *)pDVar7,&lu_local,&lu_local_1,(char *)local_48);
          DVar4 = lu_local_1;
          if (iVar3 != 1) {
            *index = lu_local_1;
            *forms_count = (Dwarf_Half)local_54;
            attrform = (uint)(ushort)local_40;
            iVar3 = _dwarf_extract_string_offset_via_str_offsets
                              (dbg,pDVar7 + lu_local,local_48,(ushort)local_40,
                               macro_context->mc_cu_context,&lu_leblen,error);
            if (iVar3 == 1) {
              return 1;
            }
            if (iVar3 == 0) {
              lu_local = 0;
              *index = DVar4;
              *offset = lu_leblen;
              iVar3 = _dwarf_extract_local_debug_str_string_given_offset
                                (dbg,attrform,lu_leblen,(char **)&lu_local,error);
              if (iVar3 == 1) {
                return 1;
              }
              pcVar5 = (char *)lu_local;
              if (iVar3 == -1) {
                pcVar5 = "<:No string available>";
              }
            }
            else {
              *index = DVar4;
              *offset = 0;
              pcVar5 = "<.debug_str_offsets not available>";
            }
            goto LAB_001c8b0f;
          }
        }
      }
      pcVar5 = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
      DVar6 = 0x149;
      goto LAB_001c878f;
    }
  }
  pcVar5 = "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header";
  DVar6 = 0x142;
LAB_001c878f:
  _dwarf_error_string(dbg,error,DVar6,pcVar5);
  return 1;
}

Assistant:

int
dwarf_get_macro_defundef(Dwarf_Macro_Context macro_context,
    Dwarf_Unsigned op_number,
    Dwarf_Unsigned * line_number,
    Dwarf_Unsigned * index,
    Dwarf_Unsigned * offset,
    Dwarf_Half     * forms_count,
    const char     ** macro_string,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Small *mdata = 0;
    int res = 0;
    Dwarf_Small *startptr = 0;
    Dwarf_Small *endptr = 0;
    Dwarf_Half lformscount = 0;
    struct Dwarf_Macro_Operator_s *curop = 0;
    unsigned macop = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    if (op_number >= macro_context->mc_macro_ops_count) {
        _dwarf_error(dbg, error,DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    curop = macro_context->mc_ops + op_number;
    macop = curop->mo_opcode;
    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    mdata = curop->mo_data;
    lformscount = curop->mo_form->mf_formcount;
    if (lformscount != 2) {
        /*_dwarf_error(dbg, error,DW_DLE_MACRO_OPCODE_FORM_BAD);*/
        return DW_DLV_NO_ENTRY;
    }
    switch(macop){
    case DW_MACRO_define:
    case DW_MACRO_undef: {
        Dwarf_Unsigned linenum = 0;
        const char * content = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        content = (const char *)mdata;
        res = _dwarf_check_string_valid(dbg,
            startptr,mdata, endptr,
            DW_DLE_MACRO_STRING_BAD,error);
        if (res != DW_DLV_OK) {
            return res;
        }
        *line_number = linenum;
        *index = 0;
        *offset = 0;
        *forms_count = lformscount;
        *macro_string = content;
        }
        return DW_DLV_OK;
    case DW_MACRO_define_strp:
    case DW_MACRO_undef_strp: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned stringoffset = 0;
        Dwarf_Small form1 =  curop->mo_form->mf_formbytes[1];
        char * localstr = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        READ_UNALIGNED_CK(dbg,stringoffset,Dwarf_Unsigned,
            mdata,macro_context->mc_offset_size,
            error,endptr);
        res = _dwarf_extract_local_debug_str_string_given_offset(dbg,
            form1,
            stringoffset,
            &localstr,
            error);
        *index = 0;
        *line_number = linenum;
        *offset = stringoffset;
        *forms_count = lformscount;
        if (res == DW_DLV_ERROR) {
            *macro_string = "<Error: getting local .debug_str>";
            return res;
        } else if (res == DW_DLV_NO_ENTRY) {
            *macro_string = "<Error: NO_ENTRY on "
                ".debug_string (strp)>";
        } else {
            *macro_string = (const char *)localstr;
        }
        }
        return DW_DLV_OK;
    case DW_MACRO_define_strx:
    case DW_MACRO_undef_strx: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned stringindex = 0;
        Dwarf_Unsigned offsettostr= 0;
        int ress = 0;
        Dwarf_Byte_Ptr mdata_copy = 0;
        Dwarf_Small form1 =  curop->mo_form->mf_formbytes[1];

        DECODE_LEB128_UWORD_CK(mdata,linenum, dbg, error,endptr);
        *line_number = linenum;
        mdata_copy = mdata;
        DECODE_LEB128_UWORD_CK(mdata_copy,stringindex,
            dbg, error,endptr);
        /* mdata_copy is for call below */

        *index = stringindex;
        *forms_count = lformscount;

        /* Redoes the index-getting. Gets offset. */
        ress = _dwarf_extract_string_offset_via_str_offsets(dbg,
            mdata_copy,
            endptr,
            form1,
            macro_context->mc_cu_context,
            &offsettostr,
            error);
        if (ress  == DW_DLV_ERROR) {
            return ress;
        }
        if (ress == DW_DLV_OK) {
            char *localstr = 0;

            *index = stringindex;
            *offset = offsettostr;
            ress =
                _dwarf_extract_local_debug_str_string_given_offset(
                dbg,
                form1,
                offsettostr,
                &localstr,
                error);
            if (ress == DW_DLV_ERROR) {
                return ress;
            } else if (ress == DW_DLV_NO_ENTRY){
                *macro_string = "<:No string available>";
            } else {
                *macro_string = (const char *)localstr;
                /* All is ok. */
            }
        } else {
            *index = stringindex;
            *offset = 0;
            *macro_string = "<.debug_str_offsets not available>";
        }
        }
        return DW_DLV_OK;
    case DW_MACRO_define_sup:
    case DW_MACRO_undef_sup: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned supoffset = 0;
        char *localstring = 0;
        int resup = 0;
        Dwarf_Error lerr = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        READ_UNALIGNED_CK(dbg,supoffset,Dwarf_Unsigned,
            mdata,macro_context->mc_offset_size,
            error,endptr);
        *line_number = linenum;
        *index = 0;
        *offset = supoffset;
        *forms_count = lformscount;
        resup = _dwarf_get_string_from_tied(dbg, supoffset,
            &localstring, &lerr);
        if (resup != DW_DLV_OK) {
            if (resup == DW_DLV_ERROR) {
                Dwarf_Unsigned myerrno =
                    (unsigned int)dwarf_errno(lerr);
                if (myerrno == DW_DLE_NO_TIED_FILE_AVAILABLE) {
                    *macro_string =
                        (char *)"<DW_FORM_str_sup-no-tied_file>";
                } else {
                    _dwarf_error(dbg,error,myerrno);
                    *macro_string =
                        (char *)"<Error: DW_FORM_str_sup-got-error>";
                }
                dwarf_dealloc(dbg,lerr,DW_DLA_ERROR);
            } else {
                *macro_string = "<DW_FORM_str_sup-no-entry>";
            }
            return resup;
        }
        *macro_string = (const char *)localstring;
        /*  If NO ENTRY available, return DW_DLV_NO_ENTRY.
            We suspect this is better than DW_DLV_OK.  */
        return resup;
        }
    default:
        _dwarf_error(dbg,error,DW_DLE_MACRO_OP_UNHANDLED);
        return DW_DLV_ERROR;
    }
    return DW_DLV_NO_ENTRY;
}